

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O1

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *objToStore,
               XSerializeEngine *serEng)

{
  uint ui;
  XMLSize_t XVar1;
  bool bVar2;
  int iVar3;
  XSerializedObjectId_t XVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar5;
  uint *puVar6;
  void **ppvVar7;
  RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *pRVar8;
  RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *pRVar9;
  void *__buf;
  XMLSize_t XVar10;
  ValueVectorOf<unsigned_int> ids;
  ValueVectorOf<void_*> keys;
  RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> e;
  ValueVectorOf<unsigned_int> local_b8;
  ValueVectorOf<void_*> local_90;
  RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> local_68;
  RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *local_38;
  
  bVar2 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar2) {
    XSerializeEngine::writeSize(serEng,objToStore->fHashModulus);
    local_68.fMemoryManager = objToStore->fMemoryManager;
    local_68.super_XMLEnumerator<xercesc_4_0::XSAnnotation>._vptr_XMLEnumerator =
         (_func_int **)&PTR__RefHashTableOfEnumerator_00416850;
    local_68.fAdopted = false;
    local_68.fCurElem = (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0;
    local_68.fCurHash = 0;
    pRVar8 = local_68.fCurElem;
    if (objToStore->fHashModulus != 0) {
      XVar1 = 1;
      do {
        XVar10 = XVar1;
        pRVar8 = objToStore->fBucketList[XVar10 - 1];
        if (objToStore->fBucketList[XVar10 - 1] !=
            (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0) break;
        XVar1 = XVar10 + 1;
        pRVar8 = local_68.fCurElem;
        local_68.fCurHash = XVar10;
      } while (XVar10 != objToStore->fHashModulus);
    }
    local_68.fCurElem = pRVar8;
    local_68.fToEnum = objToStore;
    local_b8.fMemoryManager = XSerializeEngine::getMemoryManager(serEng);
    local_b8.fCallDestructor = false;
    local_b8.fCurCount = 0;
    local_b8.fMaxCount = 0x10;
    local_b8.fElemList = (uint *)0x0;
    iVar3 = (*(local_b8.fMemoryManager)->_vptr_MemoryManager[3])(local_b8.fMemoryManager);
    local_b8.fElemList = (uint *)CONCAT44(extraout_var,iVar3);
    local_38 = objToStore;
    memset(local_b8.fElemList,0,local_b8.fMaxCount << 2);
    local_90.fMemoryManager = XSerializeEngine::getMemoryManager(serEng);
    local_90.fCallDestructor = false;
    local_90.fCurCount = 0;
    local_90.fMaxCount = 0x10;
    local_90.fElemList = (void **)0x0;
    iVar3 = (*(local_90.fMemoryManager)->_vptr_MemoryManager[3])(local_90.fMemoryManager);
    local_90.fElemList = (void **)CONCAT44(extraout_var_00,iVar3);
    memset(local_90.fElemList,0,local_90.fMaxCount << 3);
    while ((XVar1 = local_b8.fCurCount,
           local_68.fCurElem != (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0 ||
           (local_68.fCurHash != (local_68.fToEnum)->fHashModulus))) {
      pvVar5 = RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::
               nextElementKey(&local_68);
      XVar4 = XSerializeEngine::lookupStorePool(serEng,pvVar5);
      if (XVar4 != 0) {
        ValueVectorOf<unsigned_int>::ensureExtraCapacity(&local_b8,1);
        local_b8.fElemList[local_b8.fCurCount] = XVar4;
        local_b8.fCurCount = local_b8.fCurCount + 1;
        ValueVectorOf<void_*>::ensureExtraCapacity(&local_90,1);
        local_90.fElemList[local_90.fCurCount] = pvVar5;
        local_90.fCurCount = local_90.fCurCount + 1;
      }
    }
    XSerializeEngine::writeSize(serEng,local_b8.fCurCount);
    if (XVar1 != 0) {
      XVar10 = 0;
      do {
        puVar6 = ValueVectorOf<unsigned_int>::elementAt(&local_b8,XVar10);
        ui = *puVar6;
        ppvVar7 = ValueVectorOf<void_*>::elementAt(&local_90,XVar10);
        pvVar5 = *ppvVar7;
        pRVar8 = local_38->fBucketList[(ulong)pvVar5 % local_38->fHashModulus];
        pRVar9 = (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0;
        if (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0) {
          do {
            pRVar9 = pRVar8;
            if (pRVar8->fKey == pvVar5) goto LAB_002d62a5;
            pRVar8 = pRVar8->fNext;
          } while (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0);
          pRVar9 = (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0;
        }
LAB_002d62a5:
        if (pRVar9 == (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0) {
          iVar3 = 0;
        }
        else {
          iVar3 = (int)pRVar9->fData;
        }
        XSerializeEngine::operator<<(serEng,ui);
        XSerializeEngine::write(serEng,iVar3,__buf,(size_t)pvVar5);
        XVar10 = XVar10 + 1;
      } while (XVar10 != XVar1);
    }
    (*(local_90.fMemoryManager)->_vptr_MemoryManager[4])(local_90.fMemoryManager,local_90.fElemList)
    ;
    (*(local_b8.fMemoryManager)->_vptr_MemoryManager[4])(local_b8.fMemoryManager,local_b8.fElemList)
    ;
    RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::
    ~RefHashTableOfEnumerator(&local_68);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefHashTableOf<XSAnnotation, PtrHasher>* const objToStore
                                    , XSerializeEngine&              serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        serEng.writeSize (objToStore->getHashModulus());

        RefHashTableOfEnumerator<XSAnnotation, PtrHasher> e(objToStore, false, objToStore->getMemoryManager());

#ifdef XERCES_DEBUG_SORT_GRAMMAR
        //get the total item number
        unsigned int   itemNumber = 0;
        while (e.hasMoreElements())
        {
            void* key = e.nextElementKey();
            XSerializeEngine::XSerializedObjectId_t keyId = serEng.lookupStorePool(key);

            if (keyId)
                itemNumber++;
        }

        serEng.writeSize (itemNumber);
        e.Reset();

        //to sort the key
        //though keyId is not supposed to be involved in compare
        //we merely use the KeySet to encap both the string key and keyid
        SortArray sortArray(itemNumber, objToStore->getMemoryManager());
        while (e.hasMoreElements())
        {
            void* key = e.nextElementKey();
            XSerializeEngine::XSerializedObjectId_t keyId = serEng.lookupStorePool(key);

            if (keyId)
            {
                KeySet* keySet =
                    new (objToStore->getMemoryManager()) KeySet((XMLCh*)key, keyId, 0, objToStore->getMemoryManager());
                sortArray.addElement(keySet);
            }

        }

        sortArray.sort();

        //to store the data
        for (XMLSize_t i=0; i < itemNumber; i++)
        {
            GET_NEXT_KEYSET()

            XSerializeEngine::XSerializedObjectId_t keyId = (XSerializeEngine::XSerializedObjectId_t)intKey1;
            XSAnnotation* data = objToStore->get(strKey);

            serEng<<keyId;
            serEng<<data;
        }
#else
        ValueVectorOf<XSerializeEngine::XSerializedObjectId_t> ids(16, serEng.getMemoryManager());
        ValueVectorOf<void*> keys(16, serEng.getMemoryManager());

        while (e.hasMoreElements())
        {
            void* key = e.nextElementKey();
            XSerializeEngine::XSerializedObjectId_t keyId = serEng.lookupStorePool(key);

            if (keyId)
            {
                ids.addElement(keyId);
                keys.addElement(key);
            }
        }

        XMLSize_t itemNumber = ids.size();
        serEng.writeSize (itemNumber);

        for (XMLSize_t i=0; i<itemNumber; i++)
        {
            XSerializeEngine::XSerializedObjectId_t keyId = ids.elementAt(i);
            XSAnnotation* data = objToStore->get(keys.elementAt(i));
            serEng<<keyId;
            serEng<<data;
        }
#endif
    }
}